

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walHashGet(Wal *pWal,int iHash,WalHashLoc *pLoc)

{
  u32 **ppPage;
  int iVar1;
  u32 *puVar2;
  u32 uVar3;
  
  ppPage = &pLoc->aPgno;
  if (iHash < pWal->nWiData) {
    puVar2 = pWal->apWiData[iHash];
    *ppPage = puVar2;
    if (puVar2 != (u32 *)0x0) goto LAB_001370da;
  }
  iVar1 = walIndexPageRealloc(pWal,iHash,ppPage);
  if (iVar1 != 0) {
    return iVar1;
  }
  puVar2 = *ppPage;
LAB_001370da:
  pLoc->aHash = (ht_slot *)(puVar2 + 0x1000);
  uVar3 = iHash * 0x1000 - 0x22;
  if (iHash == 0) {
    uVar3 = 0;
    puVar2 = puVar2 + 0x22;
  }
  pLoc->iZero = uVar3;
  pLoc->aPgno = puVar2 + -1;
  return 0;
}

Assistant:

static int walHashGet(
  Wal *pWal,                      /* WAL handle */
  int iHash,                      /* Find the iHash'th table */
  WalHashLoc *pLoc                /* OUT: Hash table location */
){
  int rc;                         /* Return code */

  rc = walIndexPage(pWal, iHash, &pLoc->aPgno);
  assert( rc==SQLITE_OK || iHash>0 );

  if( rc==SQLITE_OK ){
    pLoc->aHash = (volatile ht_slot *)&pLoc->aPgno[HASHTABLE_NPAGE];
    if( iHash==0 ){
      pLoc->aPgno = &pLoc->aPgno[WALINDEX_HDR_SIZE/sizeof(u32)];
      pLoc->iZero = 0;
    }else{
      pLoc->iZero = HASHTABLE_NPAGE_ONE + (iHash-1)*HASHTABLE_NPAGE;
    }
    pLoc->aPgno = &pLoc->aPgno[-1];
  }
  return rc;
}